

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_uart.c
# Opt level: O1

int UartInitialize(UartConfig *config)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  pthread_t pid;
  termios local_50;
  
  uart_fd = open(config->device,0x902);
  if (uart_fd == -1) {
    iVar1 = LogLevelValid(0);
    if (iVar1 == 0) {
      return -1;
    }
    piVar3 = __errno_location();
    pcVar6 = strerror(*piVar3);
    LogWrite(0,"uart","UartInitialize",0x9b,"open %s failed[%s]",config,pcVar6);
    return -1;
  }
  tcgetattr(uart_fd,&local_50);
  tcflush(uart_fd,2);
  cfsetispeed(&local_50,config->speed);
  cfsetospeed(&local_50,config->speed);
  iVar1 = tcsetattr(uart_fd,0,&local_50);
  if (iVar1 == 0) {
    tcflush(uart_fd,2);
    iVar1 = tcgetattr(uart_fd,&local_50);
    if (iVar1 == 0) {
      cfmakeraw(&local_50);
      local_50.c_iflag._0_1_ = (byte)local_50.c_iflag | 0x10;
      local_50.c_cflag = local_50.c_cflag & 0xffffffbf | 0x30;
      local_50.c_cc[5] = '\0';
      local_50.c_cc[6] = '\0';
      iVar1 = tcsetattr(uart_fd,0,&local_50);
      if (iVar1 == 0) {
        tcflush(uart_fd,2);
        ringbuf = (RingBufferHandle)RingBufferCreate(0x400);
        is_running = 1;
        pthread_create((pthread_t *)&local_50,(pthread_attr_t *)0x0,_recv_task,(void *)0x0);
        pthread_detach(CONCAT71(local_50._1_7_,(byte)local_50.c_iflag));
        pthread_create((pthread_t *)&local_50,(pthread_attr_t *)0x0,_protocol_stack_parse_task,
                       (void *)0x0);
        pthread_detach(CONCAT71(local_50._1_7_,(byte)local_50.c_iflag));
        iVar1 = LogLevelValid(3);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar6 = "uart init success";
        iVar1 = 0;
        uVar5 = 3;
        uVar4 = 0xad;
        goto LAB_00102888;
      }
    }
    iVar2 = LogLevelValid(0);
    iVar1 = -1;
    if (iVar2 == 0) {
      return -1;
    }
    pcVar6 = "set parity failed";
    uVar5 = 0;
    uVar4 = 0xa5;
  }
  else {
    iVar2 = LogLevelValid(0);
    iVar1 = -1;
    if (iVar2 == 0) {
      return -1;
    }
    pcVar6 = "set speed failed";
    uVar5 = 0;
    uVar4 = 0xa0;
  }
LAB_00102888:
  LogWrite(uVar5,"uart","UartInitialize",uVar4,pcVar6);
  return iVar1;
}

Assistant:

int UartInitialize(UartConfig *config) {
  uart_fd = open(config->device, O_RDWR | O_NOCTTY | O_NDELAY);
  if (-1 == uart_fd) {
    LOGE(TAG, "open %s failed[%s]", config->device, strerror(errno));
    return -1;
  }

  if (0 != _set_speed(&config->speed)) {
    LOGE(TAG, "set speed failed");
    return -1;
  }

  if (0 != _set_parity()) {
    LOGE(TAG, "set parity failed");
    return -1;
  }

  ringbuf = RingBufferCreate(1024);
  is_running = 1;
  _create_worker_thread();

  LOGD(TAG, "uart init success");
  return 0;
}